

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O0

UnitNode * enqueue(UnitList *queue,void *unit)

{
  UnitNode *pUVar1;
  UnitNode *newNode;
  void *unit_local;
  UnitList *queue_local;
  
  pUVar1 = (UnitNode *)malloc(0x18);
  pUVar1->unit = unit;
  if (queue->count == 0) {
    queue->head = pUVar1;
    queue->tail = pUVar1;
    pUVar1->next = (UnitNode *)0x0;
    pUVar1->prev = (UnitNode *)0x0;
  }
  else {
    pUVar1->next = queue->head;
    pUVar1->prev = (UnitNode *)0x0;
    queue->head = pUVar1;
    queue->head->next->prev = pUVar1;
  }
  queue->count = queue->count + 1;
  return pUVar1;
}

Assistant:

struct UnitNode *enqueue(struct UnitList *queue, void *unit) {

    struct UnitNode *newNode = malloc(sizeof(struct UnitNode));
    newNode->unit = unit;

    if (queue->count) {
        newNode->next = queue->head;
        newNode->prev = NULL;
        queue->head = newNode;
        queue->head->next->prev = newNode;

    } else {
        queue->head = newNode;
        queue->tail = newNode;
        newNode->next = NULL;
        newNode->prev = NULL;
    }

    queue->count++;

    return newNode;

}